

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O0

void avro::codec_traits<umu::_union_map_union_Union__1__>::decode
               (Decoder *d,_union_map_union_Union__1__ *v)

{
  ulong uVar1;
  undefined8 uVar2;
  long *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
  vv;
  size_t n;
  string *in_stack_ffffffffffffff58;
  _union_map_union_Union__1__ *in_stack_ffffffffffffff60;
  _union_map_union_Union__1__ *this;
  _union_map_union_Union__1__ local_80;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  uVar1 = (**(code **)(*in_RDI + 0xb0))();
  if (uVar1 < 2) {
    if (uVar1 == 0) {
      this = &local_80;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
             *)0x2d0a77);
      decode<std::map<std::__cxx11::string,umu::r3,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,umu::r3>>>>
                ((Decoder *)this,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
                  *)in_stack_ffffffffffffff58);
      umu::_union_map_union_Union__1__::set_map
                (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
                       *)in_stack_ffffffffffffff58);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
              *)0x2d0aa9);
    }
    else if (uVar1 == 1) {
      (**(code **)(*in_RDI + 0x18))();
      umu::_union_map_union_Union__1__::set_null(in_stack_ffffffffffffff60);
    }
    return;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Exception::Exception((Exception *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void decode(Decoder& d, umu::_union_map_union_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::map<std::string, umu::r3 > vv;
                avro::decode(d, vv);
                v.set_map(vv);
            }
            break;
        case 1:
            d.decodeNull();
            v.set_null();
            break;
        }
    }